

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatFileItem.cpp
# Opt level: O0

string * __thiscall
DatUnpacker::DatFileItem::name_abi_cxx11_(string *__return_storage_ptr__,DatFileItem *this)

{
  DatFileItem *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->_name);
  return __return_storage_ptr__;
}

Assistant:

std::string DatFileItem::name()
    {
        return _name;
    }